

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JUnit.cpp
# Opt level: O1

void __thiscall celero::JUnit::save(JUnit *this)

{
  _Tuple_impl<0UL,_celero::JUnit::Impl_*,_std::default_delete<celero::JUnit::Impl>_> _Var1;
  ExperimentResult *pEVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  pointer psVar4;
  char cVar5;
  bool bVar6;
  ostream *poVar7;
  uint64_t uVar8;
  Experiment *pEVar9;
  _Rb_tree_node_base *p_Var10;
  pointer psVar11;
  long lVar12;
  double dVar13;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  vector<std::shared_ptr<celero::ExperimentResult>,_std::allocator<std::shared_ptr<celero::ExperimentResult>_>_>
  runs;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<celero::ExperimentResult>,_std::allocator<std::shared_ptr<celero::ExperimentResult>_>_>_>
  i;
  ofstream ofs;
  double local_2c8;
  vector<std::shared_ptr<celero::ExperimentResult>,_std::allocator<std::shared_ptr<celero::ExperimentResult>_>_>
  local_2b0;
  string local_298;
  _Rb_tree_node_base *local_278;
  _Rb_tree_node_base *local_270;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<celero::ExperimentResult>,_std::allocator<std::shared_ptr<celero::ExperimentResult>_>_>_>
  local_268;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  std::ofstream::ofstream((string *)&local_230);
  std::ofstream::open((string *)&local_230,
                      (_Ios_Openmode)
                      (Impl *)(this->pimpl)._pimpl._M_t.
                              super___uniq_ptr_impl<celero::JUnit::Impl,_std::default_delete<celero::JUnit::Impl>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_celero::JUnit::Impl_*,_std::default_delete<celero::JUnit::Impl>_>
                              .super__Head_base<0UL,_celero::JUnit::Impl_*,_false>);
  cVar5 = std::__basic_file<char>::is_open();
  if (cVar5 != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"<?xml version=\"1.0\" encoding=\"UTF-8\" ?>",0x27);
    std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
    std::ostream::put((char)&local_230);
    std::ostream::flush();
    _Var1.super__Head_base<0UL,_celero::JUnit::Impl_*,_false>._M_head_impl =
         (this->pimpl)._pimpl._M_t.
         super___uniq_ptr_impl<celero::JUnit::Impl,_std::default_delete<celero::JUnit::Impl>_>._M_t.
         super__Tuple_impl<0UL,_celero::JUnit::Impl_*,_std::default_delete<celero::JUnit::Impl>_>.
         super__Head_base<0UL,_celero::JUnit::Impl_*,_false>;
    p_Var10 = *(_Rb_tree_node_base **)
               ((long)_Var1.super__Head_base<0UL,_celero::JUnit::Impl_*,_false>._M_head_impl + 0x38)
    ;
    local_278 = (_Rb_tree_node_base *)
                ((long)_Var1.super__Head_base<0UL,_celero::JUnit::Impl_*,_false>._M_head_impl + 0x28
                );
    if (p_Var10 != local_278) {
      do {
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<celero::ExperimentResult>,_std::allocator<std::shared_ptr<celero::ExperimentResult>_>_>_>
        ::pair(&local_268,
               (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<celero::ExperimentResult>,_std::allocator<std::shared_ptr<celero::ExperimentResult>_>_>_>
                *)(p_Var10 + 1));
        std::
        vector<std::shared_ptr<celero::ExperimentResult>,_std::allocator<std::shared_ptr<celero::ExperimentResult>_>_>
        ::vector(&local_2b0,&local_268.second);
        psVar4 = local_2b0.
                 super__Vector_base<std::shared_ptr<celero::ExperimentResult>,_std::allocator<std::shared_ptr<celero::ExperimentResult>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        local_270 = p_Var10;
        if (local_2b0.
            super__Vector_base<std::shared_ptr<celero::ExperimentResult>,_std::allocator<std::shared_ptr<celero::ExperimentResult>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            local_2b0.
            super__Vector_base<std::shared_ptr<celero::ExperimentResult>,_std::allocator<std::shared_ptr<celero::ExperimentResult>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          local_2c8 = 0.0;
        }
        else {
          lVar12 = 0;
          psVar11 = local_2b0.
                    super__Vector_base<std::shared_ptr<celero::ExperimentResult>,_std::allocator<std::shared_ptr<celero::ExperimentResult>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          do {
            pEVar2 = (psVar11->
                     super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr;
            p_Var3 = (psVar11->
                     super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>).
                     _M_refcount._M_pi;
            if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
                UNLOCK();
              }
              else {
                p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
              }
            }
            bVar6 = ExperimentResult::getFailure(pEVar2);
            if (!bVar6) {
              pEVar9 = ExperimentResult::getExperiment(pEVar2);
              dVar13 = Experiment::getBaselineTarget(pEVar9);
              if (0.0 < dVar13) {
                ExperimentResult::getBaselineMeasurement(pEVar2);
                pEVar9 = ExperimentResult::getExperiment(pEVar2);
                Experiment::getBaselineTarget(pEVar9);
              }
              uVar8 = ExperimentResult::getRunTime(pEVar2);
              lVar12 = lVar12 + uVar8;
            }
            if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
            }
            psVar11 = psVar11 + 1;
          } while (psVar11 != psVar4);
          auVar15._8_4_ = (int)((ulong)lVar12 >> 0x20);
          auVar15._0_8_ = lVar12;
          auVar15._12_4_ = 0x45300000;
          local_2c8 = ((auVar15._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)lVar12) - 4503599627370496.0)) * 1e-06;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_230,"<testsuite errors=\"",0x13);
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&local_230);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\" ",2);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"tests=\"",7);
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&local_230);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\" ",2);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"time=\"",6);
        poVar7 = std::ostream::_M_insert<double>(local_2c8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\" ",2);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"failures=\"",10);
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&local_230);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\" ",2);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"name=\"",6);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_230,local_268.first._M_dataplus._M_p,
                            local_268.first._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\">",2);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        psVar4 = local_2b0.
                 super__Vector_base<std::shared_ptr<celero::ExperimentResult>,_std::allocator<std::shared_ptr<celero::ExperimentResult>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (psVar11 = local_2b0.
                       super__Vector_base<std::shared_ptr<celero::ExperimentResult>,_std::allocator<std::shared_ptr<celero::ExperimentResult>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            cVar5 = (char)(ostream *)&local_230, psVar11 != psVar4; psVar11 = psVar11 + 1) {
          pEVar2 = (psVar11->
                   super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          p_Var3 = (psVar11->
                   super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>).
                   _M_refcount._M_pi;
          if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
            }
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_230,"\t<testcase ",0xb);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"time=\"",6);
          bVar6 = ExperimentResult::getFailure(pEVar2);
          if (bVar6) {
            uVar8 = 0;
          }
          else {
            uVar8 = ExperimentResult::getRunTime(pEVar2);
          }
          auVar16._8_4_ = (int)(uVar8 >> 0x20);
          auVar16._0_8_ = uVar8;
          auVar16._12_4_ = 0x45300000;
          poVar7 = std::ostream::_M_insert<double>
                             (((auVar16._8_8_ - 1.9342813113834067e+25) +
                              ((double)CONCAT44(0x43300000,(int)uVar8) - 4503599627370496.0)) *
                              1e-06);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\" ",2);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"name=\"",6);
          pEVar9 = ExperimentResult::getExperiment(pEVar2);
          Experiment::getName_abi_cxx11_(&local_298,pEVar9);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&local_230,local_298._M_dataplus._M_p,
                              local_298._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"#",1);
          ExperimentResult::getProblemSpaceValue(pEVar2);
          poVar7 = std::ostream::_M_insert<long>((long)poVar7);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\"",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_298._M_dataplus._M_p != &local_298.field_2) {
            operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
          }
          bVar6 = ExperimentResult::getFailure(pEVar2);
          if (bVar6) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,">",1);
            std::ios::widen((char)*(undefined8 *)(local_230 + -0x18) + cVar5);
            std::ostream::put(cVar5);
            std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_230,"\t\t<error ",9);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_230,"type=\"exception\"",0x10);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"/>",2);
            std::ios::widen((char)*(undefined8 *)(local_230 + -0x18) + cVar5);
            std::ostream::put(cVar5);
            std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_230,"\t</testcase>",0xc);
          }
          else {
            pEVar9 = ExperimentResult::getExperiment(pEVar2);
            dVar13 = Experiment::getBaselineTarget(pEVar9);
            if (0.0 < dVar13) {
              dVar13 = ExperimentResult::getBaselineMeasurement(pEVar2);
              pEVar9 = ExperimentResult::getExperiment(pEVar2);
              dVar14 = Experiment::getBaselineTarget(pEVar9);
              if (dVar14 < dVar13) {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,">",1);
                std::ios::widen((char)*(undefined8 *)(local_230 + -0x18) + cVar5);
                std::ostream::put(cVar5);
                std::ostream::flush();
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_230,"\t\t<failure ",0xb);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_230,"type=\"Performance objective not met.\" ",0x26);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_230,"message=\"Measurement of ",0x18);
                dVar13 = ExperimentResult::getBaselineMeasurement(pEVar2);
                poVar7 = std::ostream::_M_insert<double>(dVar13);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar7," exceeds objective baseline of ",0x1f);
                pEVar9 = ExperimentResult::getExperiment(pEVar2);
                dVar13 = Experiment::getBaselineTarget(pEVar9);
                poVar7 = std::ostream::_M_insert<double>(dVar13);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\" ",2);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"/>",2);
                std::ios::widen((char)*(undefined8 *)(local_230 + -0x18) + cVar5);
                std::ostream::put(cVar5);
                std::ostream::flush();
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_230,"\t</testcase>",0xc);
                goto LAB_0012ee23;
              }
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"/>",2);
          }
LAB_0012ee23:
          std::ios::widen((char)*(undefined8 *)(local_230 + -0x18) + cVar5);
          std::ostream::put(cVar5);
          std::ostream::flush();
          if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
          }
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"</testsuite>",0xc)
        ;
        std::ios::widen((char)*(undefined8 *)(local_230 + -0x18) + cVar5);
        std::ostream::put(cVar5);
        std::ostream::flush();
        std::
        vector<std::shared_ptr<celero::ExperimentResult>,_std::allocator<std::shared_ptr<celero::ExperimentResult>_>_>
        ::~vector(&local_2b0);
        std::
        vector<std::shared_ptr<celero::ExperimentResult>,_std::allocator<std::shared_ptr<celero::ExperimentResult>_>_>
        ::~vector(&local_268.second);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268.first._M_dataplus._M_p != &local_268.first.field_2) {
          operator_delete(local_268.first._M_dataplus._M_p,
                          local_268.first.field_2._M_allocated_capacity + 1);
        }
        p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(local_270);
      } while (p_Var10 != local_278);
    }
    std::ofstream::close();
  }
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _sqrt;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void JUnit::save()
{
	std::ofstream ofs;
	ofs.open(this->pimpl->fileName);

	if(ofs.is_open() == true)
	{
		const auto os = &ofs;

		*os << "<?xml version=\"1.0\" encoding=\"UTF-8\" ?>" << std::endl;

		for(auto i : this->pimpl->results)
		{
			uint64_t testSuiteTime = 0;
			size_t testSuiteFailures = 0;
			size_t testSuiteErrors = 0;

			const auto runs = i.second;

			for(auto j : runs)
			{
				if(j->getFailure())
				{
					testSuiteErrors++;
					continue;
				}
				else if((j->getExperiment()->getBaselineTarget() > 0.0) && (j->getBaselineMeasurement() > j->getExperiment()->getBaselineTarget()))
				{
					testSuiteFailures++;
				}

				testSuiteTime += j->getRunTime();
			}

			*os << "<testsuite errors=\"" << testSuiteErrors << "\" ";
			*os << "tests=\"" << i.second.size() << "\" ";
			*os << "time=\"" << celero::timer::ConvertSystemTime(testSuiteTime) << "\" ";
			*os << "failures=\"" << testSuiteFailures << "\" ";
			*os << "name=\"" << i.first << "\">" << std::endl;

			for(auto j : runs)
			{
				*os << "\t<testcase ";
				*os << "time=\"" << celero::timer::ConvertSystemTime(j->getFailure() ? 0 : j->getRunTime()) << "\" ";
				*os << "name=\"" << j->getExperiment()->getName() << "#" << j->getProblemSpaceValue() << "\"";

				// Compare measured to objective
				if(j->getFailure())
				{
					// Error
					*os << ">" << std::endl;

					*os << "\t\t<error ";
					*os << "type=\"exception\"";
					*os << "/>" << std::endl;

					*os << "\t</testcase>" << std::endl;
				}
				else if((j->getExperiment()->getBaselineTarget() > 0.0) && (j->getBaselineMeasurement() > j->getExperiment()->getBaselineTarget()))
				{
					// Failure
					*os << ">" << std::endl;

					*os << "\t\t<failure ";
					*os << "type=\"Performance objective not met.\" ";
					*os << "message=\"Measurement of " << j->getBaselineMeasurement() << " exceeds objective baseline of "
						<< j->getExperiment()->getBaselineTarget() << "\" ";
					*os << "/>" << std::endl;

					*os << "\t</testcase>" << std::endl;
				}
				else
				{
					// Success
					*os << "/>" << std::endl;
				}
			}

			*os << "</testsuite>" << std::endl;
		}

		ofs.close();
	}
}